

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

FName CommandDrawSwitchableImage::LookupKeySpecies(int keynum)

{
  PClassActor *pPVar1;
  int iVar2;
  int *in_RDI;
  ulong uVar3;
  PClassActor *pPVar4;
  
  if ((ulong)PClassActor::AllActorClasses.Count != 0) {
    uVar3 = 0;
    do {
      pPVar1 = PClassActor::AllActorClasses.Array[uVar3];
      pPVar4 = pPVar1;
      if (pPVar1 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_004c27ae:
        if ((uint)(pPVar1->super_PClass).Defaults[0x4fc] == keynum) {
          iVar2 = (pPVar1->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName
                  .Index;
          goto LAB_004c27d5;
        }
      }
      else {
        do {
          pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
          if (pPVar4 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
        } while (pPVar4 != (PClassActor *)0x0);
        if (pPVar4 != (PClassActor *)0x0) goto LAB_004c27ae;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != PClassActor::AllActorClasses.Count);
  }
  iVar2 = 0;
LAB_004c27d5:
  *in_RDI = iVar2;
  return (FName)(int)in_RDI;
}

Assistant:

static FName LookupKeySpecies(int keynum)
		{
			for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
			{
				PClassActor *cls = PClassActor::AllActorClasses[i];
				if (cls->IsDescendantOf(RUNTIME_CLASS(AKey)))
				{
					AKey *key = (AKey *)GetDefaultByType(cls);
					if (key->KeyNumber == keynum)
						return cls->TypeName;
				}
			}
			return NAME_None;
		}